

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.hpp
# Opt level: O1

void __thiscall
duckdb::BinarySerializer::VarIntEncode<signed_char>(BinarySerializer *this,char value)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  uint8_t buffer [16];
  byte local_18 [24];
  
  local_18[0] = 0;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  local_18[4] = 0;
  local_18[5] = 0;
  local_18[6] = 0;
  local_18[7] = 0;
  local_18[8] = 0;
  local_18[9] = 0;
  local_18[10] = 0;
  local_18[0xb] = 0;
  local_18[0xc] = 0;
  local_18[0xd] = 0;
  local_18[0xe] = 0;
  local_18[0xf] = 0;
  lVar3 = 0;
  do {
    bVar2 = value & 0x7f;
    bVar4 = 0x3f < (byte)value;
    if (bVar4) {
      bVar2 = bVar2 | ((value & 0x40U) == 0 || -1 < value) << 7;
    }
    bVar5 = -1 < value;
    bVar1 = value & 0x40;
    local_18[lVar3] = bVar2;
    lVar3 = lVar3 + 1;
    value = value >> 7;
  } while (bVar4 && (bVar1 == 0 || bVar5));
  (**this->stream->_vptr_WriteStream)(this->stream,local_18);
  return;
}

Assistant:

void VarIntEncode(T value) {
		uint8_t buffer[16] = {};
		auto write_size = EncodingUtil::EncodeLEB128<T>(buffer, value);
		D_ASSERT(write_size <= sizeof(buffer));
		WriteData(buffer, write_size);
	}